

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O3

string * __thiscall
cmExtraSublimeTextGenerator::BuildMakeCommand
          (string *__return_storage_ptr__,cmExtraSublimeTextGenerator *this,string *make,
          char *makefile,string *target)

{
  pointer pcVar1;
  size_type sVar2;
  int iVar3;
  char *path;
  char *path_00;
  char *path_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string makefileName;
  string generator;
  string local_90;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"\"","");
  local_50[0] = local_40;
  pcVar1 = (make->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + make->_M_string_length);
  std::__cxx11::string::append((char *)local_50);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50[0]);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  (*((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->_vptr_cmGlobalGenerator[3])
            (local_50);
  iVar3 = std::__cxx11::string::compare((char *)local_50);
  if (iVar3 == 0) {
    cmSystemTools::ConvertToOutputPath_abi_cxx11_(&local_70,(cmSystemTools *)makefile,path);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_70._M_dataplus._M_p,
               (char *)(local_70._M_string_length + (long)local_70._M_dataplus._M_p));
    std::__cxx11::string::append((char *)&local_90);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_90._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(target->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_003c09ef:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_003c0a0a;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)local_50);
    if (iVar3 == 0) {
      cmSystemTools::ConvertToOutputPath_abi_cxx11_(&local_70,(cmSystemTools *)makefile,path_00);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,local_70._M_dataplus._M_p,
                 (char *)(local_70._M_string_length + (long)local_70._M_dataplus._M_p));
      std::__cxx11::string::append((char *)&local_90);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_90._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)(target->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      goto LAB_003c09ef;
    }
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    iVar3 = std::__cxx11::string::compare((char *)local_50);
    sVar2 = local_70._M_string_length;
    if (iVar3 == 0) {
      strlen(makefile);
      std::__cxx11::string::_M_replace((ulong)&local_70,0,(char *)sVar2,(ulong)makefile);
    }
    else {
      cmSystemTools::ConvertToOutputPath_abi_cxx11_(&local_90,(cmSystemTools *)makefile,path_01);
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_70._M_dataplus._M_p,
               (char *)(local_70._M_string_length + (long)local_70._M_dataplus._M_p));
    std::__cxx11::string::append((char *)&local_90);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_90._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(target->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_003c0a0a;
  }
  operator_delete(local_70._M_dataplus._M_p,
                  CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                           local_70.field_2._M_local_buf[0]) + 1);
LAB_003c0a0a:
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraSublimeTextGenerator::BuildMakeCommand(
             const std::string& make, const char* makefile,
             const std::string& target)
{
  std::string command = "\"";
  command += make + "\"";
  std::string generator = this->GlobalGenerator->GetName();
  if (generator == "NMake Makefiles")
    {
    std::string makefileName = cmSystemTools::ConvertToOutputPath(makefile);
    command += ", \"/NOLOGO\", \"/f\", \"";
    command += makefileName + "\"";
    command += ", \"VERBOSE=1\", \"";
    command += target;
    command += "\"";
    }
  else if (generator == "Ninja")
    {
    std::string makefileName = cmSystemTools::ConvertToOutputPath(makefile);
    command += ", \"-f\", \"";
    command += makefileName + "\"";
    command += ", \"-v\", \"";
    command += target;
    command += "\"";
    }
  else
    {
    std::string makefileName;
    if (generator == "MinGW Makefiles")
      {
        // no escaping of spaces in this case, see
        // http://public.kitware.com/Bug/view.php?id=10014
        makefileName = makefile;
      }
      else
      {
        makefileName = cmSystemTools::ConvertToOutputPath(makefile);
      }
    command += ", \"-f\", \"";
    command += makefileName + "\"";
    command += ", \"VERBOSE=1\", \"";
    command += target;
    command += "\"";
    }
  return command;
}